

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::EqualTest<unsigned_long,unsigned_short>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_52;
  int local_50 [6];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_38;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_28;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  
  local_50[5] = 3;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_18,local_50 + 5);
  if (local_18.m_int == 2) {
    local_50[4] = 4;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_20,local_50 + 4);
    if (local_20.m_int == 5) {
      local_50[3] = 6;
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_28,local_50 + 3);
      local_50[2] = 7;
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_52,local_50 + 2);
      if (local_28.m_int == local_52.m_int) {
        local_50[1] = 1;
        SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_30,local_50 + 1);
        if (local_30.m_int != 0) {
          local_50[0] = 0;
          SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    (&local_38,local_50);
          return local_38.m_int == 0;
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}